

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void sh4asm_parser_input_token(sh4asm_tok *tk)

{
  sh4asm_tok *tk_local;
  
  if (tk->tp == SH4ASM_TOK_NEWLINE) {
    process_line();
    n_tokens = 0;
  }
  else {
    push_token(tk);
  }
  return;
}

Assistant:

void sh4asm_parser_input_token(struct sh4asm_tok const *tk) {
    if (tk->tp == SH4ASM_TOK_NEWLINE) {
        process_line();
        n_tokens = 0;
    } else {
        push_token(tk);
    }
}